

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
SetNodeIndex(TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
             *this,int i,int64_t nodeindex)

{
  ostream *this_00;
  void *this_01;
  undefined8 in_RDX;
  int in_ESI;
  long in_RDI;
  
  if ((in_ESI < 0) || (2 < in_ESI)) {
    this_00 = std::operator<<((ostream *)&std::cout,"TPZGeoElRefLess::SetNodeIndex index error i = "
                             );
    this_01 = (void *)std::ostream::operator<<(this_00,in_ESI);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  else {
    *(undefined8 *)(in_RDI + 0x48 + (long)in_ESI * 8) = in_RDX;
  }
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::SetNodeIndex(int i,int64_t nodeindex){
	if(i<0 || i>(TGeo::NNodes - 1)){
		std::cout << "TPZGeoElRefLess::SetNodeIndex index error i = " << i << std::endl;
		return;
	}
	fGeo.fNodeIndexes[i] = nodeindex;
}